

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall Session::setSymmetricKey(Session *this,SymmetricKey *inSymmetricKey)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0xa0) != 0) {
    if (*(long *)(in_RDI + 0x58) == 0) {
      if (*(long *)(in_RDI + 0x68) == 0) {
        return;
      }
      (**(code **)(**(long **)(in_RDI + 0x68) + 0x50))
                (*(long **)(in_RDI + 0x68),*(undefined8 *)(in_RDI + 0xa0));
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x58) + 0x50))
                (*(long **)(in_RDI + 0x58),*(undefined8 *)(in_RDI + 0xa0));
    }
  }
  *(undefined8 *)(in_RDI + 0xa0) = in_RSI;
  return;
}

Assistant:

void Session::setSymmetricKey(SymmetricKey* inSymmetricKey)
{
	if (symmetricKey != NULL)
	{
		if (macOp) {
			macOp->recycleKey(symmetricKey);
		} else if (symmetricCryptoOp) {
			symmetricCryptoOp->recycleKey(symmetricKey);
		} else {
			return;
		}
	}

	symmetricKey = inSymmetricKey;
}